

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.h
# Opt level: O1

void __thiscall InvertDatabase::get_ext_item(InvertDatabase *this,int it)

{
  Partition *this_00;
  pointer piVar1;
  pointer psVar2;
  undefined8 *puVar3;
  int supsz;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> newit;
  undefined1 local_4d;
  int local_4c;
  vector<int,_std::allocator<int>_> *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> local_38;
  vector<int,_std::allocator<int>_> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_4c = Partition::partition_get_idxsup
                       ((this->partition).super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,it);
  local_48 = (vector<int,_std::allocator<int>_> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>,int&>
            (&local_40,&local_48,(allocator<std::vector<int,_std::allocator<int>_>_> *)&local_4d,
             &local_4c);
  this_00 = (this->partition).super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_48;
  local_38.super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_40._M_pi;
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
    }
  }
  Partition::partition_read_item(this_00,&local_38,it);
  if (local_38.
      super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.
               super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  piVar1 = (this->fidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar2 = (this->_items).
           super__Vector_base<std::shared_ptr<Itemset>,_std::allocator<std::shared_ptr<Itemset>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (psVar2[piVar1[it]].super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->theSupport =
       local_4c;
  *(int *)(*(long *)&((psVar2[piVar1[it]].super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->theIval).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2> + 0x10
          ) = local_4c;
  puVar3 = *(undefined8 **)
            &((psVar2[piVar1[it]].super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             theIval).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>;
  local_28 = local_48;
  local_20._M_pi = local_40._M_pi;
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
    }
  }
  *puVar3 = local_48;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar3 + 1),&local_20);
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  return;
}

Assistant:

void get_ext_item(int it) {
        int supsz = partition->partition_get_idxsup(it);
        shared_ptr<vint> newit = make_shared<vint>(supsz);
        partition->partition_read_item(newit, it);
        _items[fidx[it]]->set_support(supsz);
        _items[fidx[it]]->ival()->set_size(supsz);
        _items[fidx[it]]->ival()->set_array(newit);
    }